

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionPrivate::removeReply
          (QHttpNetworkConnectionPrivate *this,QHttpNetworkReply *reply)

{
  const_iterator __last;
  bool bVar1;
  const_iterator __first;
  pointer this_00;
  QHttpNetworkReplyPrivate *pQVar2;
  qsizetype qVar3;
  const_reference ppVar4;
  iterator obj;
  QHttpNetworkReply *in_RSI;
  QHttpNetworkConnectionPrivate *in_RDI;
  long in_FS_OFFSET;
  int j_2;
  int j_1;
  QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *seq;
  int j;
  int i;
  QHttpNetworkConnection *q;
  HttpMessagePair messagePair_1;
  HttpMessagePair messagePair;
  const_iterator it;
  const_iterator end;
  anon_class_8_1_a890020a_for__M_pred foundReply;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  ConnectionType in_stack_ffffffffffffff3c;
  ConnectionType c;
  Priority in_stack_ffffffffffffff40;
  uint uVar5;
  Operation in_stack_ffffffffffffff44;
  QObject *in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  const_iterator it_00;
  int iVar6;
  int iVar7;
  QUrl local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __first._M_node = (_Base_ptr)q_func(in_RDI);
  for (iVar7 = 0; iVar7 < in_RDI->activeChannelCount; iVar7 = iVar7 + 1) {
    if (in_RDI->channels[iVar7].reply == in_RSI) {
      in_RDI->channels[iVar7].reply = (QHttpNetworkReply *)0x0;
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                          *)0x2ef4b3);
      if (bVar1) {
        this_00 = std::
                  unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                  ::operator->((unique_ptr<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                                *)0x2ef4dd);
        QAbstractProtocolHandler::setReply(this_00,(QHttpNetworkReply *)0x0);
      }
      QUrl::QUrl(&local_20);
      QHttpNetworkRequest::QHttpNetworkRequest
                ((QHttpNetworkRequest *)in_stack_ffffffffffffff50._M_node,
                 (QUrl *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                 in_stack_ffffffffffffff40);
      iVar6 = (int)local_18;
      QHttpNetworkRequest::operator=
                ((QHttpNetworkRequest *)in_RDI,&in_stack_ffffffffffffff28->first);
      QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)in_RDI);
      QUrl::~QUrl(&local_20);
      in_RDI->channels[iVar7].resendCurrent = false;
      bVar1 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)0x2ef581);
      if ((!bVar1) &&
         (bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2ef5ac
                            ), !bVar1)) {
        QHttpNetworkConnectionChannel::requeueCurrentlyPipelinedRequests
                  ((QHttpNetworkConnectionChannel *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
      pQVar2 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2ef5da);
      bVar1 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled(pQVar2);
      if ((bVar1) || (bVar1 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)0x2ef5f0), !bVar1))
      {
        bVar1 = QHttpNetworkReply::isAborted((QHttpNetworkReply *)0x2ef5fe);
        if (bVar1) {
          QHttpNetworkConnectionChannel::abort
                    ((QHttpNetworkConnectionChannel *)(in_RDI->channels + iVar7));
        }
        else {
          QHttpNetworkConnectionChannel::close
                    ((QHttpNetworkConnectionChannel *)(in_RDI->channels + iVar7),iVar6);
        }
      }
      QMetaObject::invokeMethod<>
                (in_stack_ffffffffffffff48,
                 (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
      goto LAB_002efae6;
    }
    iVar6 = 0;
    while( true ) {
      in_stack_ffffffffffffff28 = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)(long)iVar6;
      qVar3 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                        (&in_RDI->channels[iVar7].alreadyPipelinedRequests);
      if (qVar3 <= (long)in_stack_ffffffffffffff28) break;
      ppVar4 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::at
                         ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
                          (qsizetype)in_stack_ffffffffffffff28);
      if (ppVar4->second == in_RSI) {
        QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt
                  ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
                   (qsizetype)in_stack_ffffffffffffff28);
        QHttpNetworkConnectionChannel::requeueCurrentlyPipelinedRequests
                  ((QHttpNetworkConnectionChannel *)
                   CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (in_RDI->channels[iVar7].reply != (QHttpNetworkReply *)0x0) {
          pQVar2 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2ef778);
          pQVar2->forceConnectionCloseEnabled = true;
        }
        QMetaObject::invokeMethod<>
                  (in_stack_ffffffffffffff48,
                   (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c);
        goto LAB_002efae6;
      }
      iVar6 = iVar6 + 1;
    }
    it_00._M_node = (_Base_ptr)&in_RDI->channels[iVar7].h2RequestsToSend;
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::cend
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
               in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff50._M_node =
         (_Base_ptr)
         QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::cbegin
                   ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                    in_stack_ffffffffffffff28);
    __last.i._M_node._4_4_ = iVar7;
    __last.i._M_node._0_4_ = iVar6;
    std::
    find_if<QMultiMap<int,std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::const_iterator,QHttpNetworkConnectionPrivate::removeReply(QHttpNetworkReply*)::__0>
              ((const_iterator)__first._M_node,__last,
               (anon_class_8_1_a890020a_for__M_pred)it_00._M_node);
    bVar1 = ::operator!=((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffff28);
    if (bVar1) {
      obj = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                      ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (const_iterator)it_00._M_node);
      QMetaObject::invokeMethod<>
                ((QObject *)obj.i._M_node,
                 (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
      goto LAB_002efae6;
    }
  }
  bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                    ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2ef8fe);
  if (!bVar1) {
    qVar3 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                      (&in_RDI->highPriorityQueue);
    in_stack_ffffffffffffff44 = (Operation)qVar3;
    while (in_stack_ffffffffffffff44 = in_stack_ffffffffffffff44 - Get,
          -1 < (int)in_stack_ffffffffffffff44) {
      QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::at
                ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
                 (qsizetype)in_stack_ffffffffffffff28);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)in_RDI,in_stack_ffffffffffffff28)
      ;
      if (in_RSI == (QHttpNetworkReply *)0xaaaaaaaaaaaaaaaa) {
        QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt
                  ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
                   (qsizetype)in_stack_ffffffffffffff28);
        QMetaObject::invokeMethod<>
                  (in_stack_ffffffffffffff48,
                   (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff3c);
      }
      uVar5 = (uint)(in_RSI == (QHttpNetworkReply *)0xaaaaaaaaaaaaaaaa);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::~pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2ef9cb);
      if (uVar5 != 0) goto LAB_002efae6;
      in_stack_ffffffffffffff40 = HighPriority;
    }
  }
  bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                    ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2ef9ff);
  if (!bVar1) {
    qVar3 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                      (&in_RDI->lowPriorityQueue);
    c = (ConnectionType)qVar3;
    while (c = c - DirectConnection, -1 < (int)c) {
      QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::at
                ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
                 (qsizetype)in_stack_ffffffffffffff28);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)in_RDI,in_stack_ffffffffffffff28)
      ;
      if (in_RSI == (QHttpNetworkReply *)0xaaaaaaaaaaaaaaaa) {
        QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt
                  ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI,
                   (qsizetype)in_stack_ffffffffffffff28);
        QMetaObject::invokeMethod<>
                  (in_stack_ffffffffffffff48,
                   (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),c);
      }
      uVar5 = (uint)(in_RSI == (QHttpNetworkReply *)0xaaaaaaaaaaaaaaaa);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::~pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2efac6);
      if (uVar5 != 0) break;
      in_stack_ffffffffffffff40 = HighPriority;
    }
  }
LAB_002efae6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionPrivate::removeReply(QHttpNetworkReply *reply)
{
    Q_Q(QHttpNetworkConnection);

    // check if the reply is currently being processed or it is pipelined in
    for (int i = 0; i < activeChannelCount; ++i) {
        // is the reply associated the currently processing of this channel?
        if (channels[i].reply == reply) {
            channels[i].reply = nullptr;
            if (channels[i].protocolHandler)
                channels[i].protocolHandler->setReply(nullptr);
            channels[i].request = QHttpNetworkRequest();
            channels[i].resendCurrent = false;

            if (!reply->isFinished() && !channels[i].alreadyPipelinedRequests.isEmpty()) {
                // the reply had to be prematurely removed, e.g. it was not finished
                // therefore we have to requeue the already pipelined requests.
                channels[i].requeueCurrentlyPipelinedRequests();
            }

            // if HTTP mandates we should close
            // or the reply is not finished yet, e.g. it was aborted
            // we have to close that connection
            if (reply->d_func()->isConnectionCloseEnabled() || !reply->isFinished()) {
                if (reply->isAborted()) {
                    channels[i].abort();
                } else {
                    channels[i].close();
                }
            }

            QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }

        // is the reply inside the pipeline of this channel already?
        for (int j = 0; j < channels[i].alreadyPipelinedRequests.size(); j++) {
            if (channels[i].alreadyPipelinedRequests.at(j).second == reply) {
               // Remove that HttpMessagePair
               channels[i].alreadyPipelinedRequests.removeAt(j);

               channels[i].requeueCurrentlyPipelinedRequests();

               // Since some requests had already been pipelined, but we removed
               // one and re-queued the others
               // we must force a connection close after the request that is
               // currently in processing has been finished.
               if (channels[i].reply)
                   channels[i].reply->d_func()->forceConnectionCloseEnabled = true;

               QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
               return;
            }
        }
        // is the reply inside the H2 pipeline of this channel already?
        const auto foundReply = [reply](const HttpMessagePair &pair) {
            return pair.second == reply;
        };
        auto &seq = channels[i].h2RequestsToSend;
        const auto end = seq.cend();
        auto it = std::find_if(seq.cbegin(), end, foundReply);
        if (it != end) {
            seq.erase(it);
            QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
    }
    // remove from the high priority queue
    if (!highPriorityQueue.isEmpty()) {
        for (int j = highPriorityQueue.size() - 1; j >= 0; --j) {
            HttpMessagePair messagePair = highPriorityQueue.at(j);
            if (messagePair.second == reply) {
                highPriorityQueue.removeAt(j);
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                return;
            }
        }
    }
    // remove from the low priority queue
    if (!lowPriorityQueue.isEmpty()) {
        for (int j = lowPriorityQueue.size() - 1; j >= 0; --j) {
            HttpMessagePair messagePair = lowPriorityQueue.at(j);
            if (messagePair.second == reply) {
                lowPriorityQueue.removeAt(j);
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                return;
            }
        }
    }
}